

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O0

int TRUST_TOKEN_ISSUER_set_metadata_key(TRUST_TOKEN_ISSUER *ctx,uint8_t *key,size_t len)

{
  uint8_t *puVar1;
  bool bVar2;
  size_t len_local;
  uint8_t *key_local;
  TRUST_TOKEN_ISSUER *ctx_local;
  
  if (len < 0x20) {
    ERR_put_error(0x20,0,0x71,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                  ,0x1f1);
  }
  OPENSSL_free(ctx->metadata_key);
  ctx->metadata_key_len = 0;
  puVar1 = (uint8_t *)OPENSSL_memdup(key,len);
  ctx->metadata_key = puVar1;
  bVar2 = ctx->metadata_key != (uint8_t *)0x0;
  if (bVar2) {
    ctx->metadata_key_len = len;
  }
  ctx_local._4_4_ = (uint)bVar2;
  return ctx_local._4_4_;
}

Assistant:

int TRUST_TOKEN_ISSUER_set_metadata_key(TRUST_TOKEN_ISSUER *ctx,
                                        const uint8_t *key, size_t len) {
  if (len < 32) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_INVALID_METADATA_KEY);
  }
  OPENSSL_free(ctx->metadata_key);
  ctx->metadata_key_len = 0;
  ctx->metadata_key = reinterpret_cast<uint8_t *>(OPENSSL_memdup(key, len));
  if (ctx->metadata_key == NULL) {
    return 0;
  }
  ctx->metadata_key_len = len;
  return 1;
}